

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  size_type *psVar1;
  pointer pEVar2;
  istream *piVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  size_type __n;
  long lVar7;
  undefined1 local_80 [8];
  field_t field;
  pos_t pos;
  string ROW;
  int local_38;
  int KR;
  int KC;
  bool back;
  bool explore;
  
  piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,&R);
  piVar3 = (istream *)std::istream::operator>>(piVar3,&C);
  std::istream::operator>>(piVar3,&A);
  std::istream::ignore();
  __n = (size_type)R;
  field.
  super__Vector_base<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x3f;
  std::vector<ECell,_std::allocator<ECell>_>::vector
            ((vector<ECell,_std::allocator<ECell>_> *)&pos,(long)C,
             (value_type *)
             &field.
              super__Vector_base<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (allocator_type *)(ROW.field_2._M_local_buf + 0xc));
  std::
  vector<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
  ::vector((vector<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
            *)local_80,__n,(value_type *)&pos,(allocator_type *)&local_38);
  if (pos != (pos_t)0x0) {
    operator_delete((void *)pos,
                    CONCAT71(ROW._M_string_length._1_7_,(undefined1)ROW._M_string_length) -
                    (long)pos);
  }
  KR._2_1_ = 0;
  psVar1 = &ROW._M_string_length;
  do {
    piVar3 = (istream *)
             std::istream::operator>>((istream *)&std::cin,(int *)(ROW.field_2._M_local_buf + 0xc));
    std::istream::operator>>(piVar3,&local_38);
    std::istream::ignore();
    field.
    super__Vector_base<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = ROW.field_2._12_4_;
    field.
    super__Vector_base<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_38;
    if (0 < R) {
      lVar7 = 0;
      do {
        ROW._M_dataplus._M_p = (pointer)0x0;
        ROW._M_string_length._0_1_ = 0;
        pos = (pos_t)psVar1;
        std::operator>>((istream *)&std::cin,(string *)&pos);
        std::istream::ignore();
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)pos,(long)ROW._M_dataplus._M_p);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        lVar5 = (long)C;
        if (0 < lVar5) {
          pEVar2 = (((pointer)((long)local_80 + lVar7 * 0x18))->
                   super__Vector_base<ECell,_std::allocator<ECell>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar6 = 0;
          do {
            pEVar2[lVar6] = (int)*(char *)((long)pos + lVar6);
            lVar6 = lVar6 + 1;
          } while (lVar5 != lVar6);
        }
        if (pos != (pos_t)psVar1) {
          operator_delete((void *)pos,
                          CONCAT71(ROW._M_string_length._1_7_,(undefined1)ROW._M_string_length) + 1)
          ;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < R);
    }
    KR._3_1_ = 1;
    step_abi_cxx11_((string *)&pos,(field_t *)local_80,
                    (pos_t *)&field.
                              super__Vector_base<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (bool *)((long)&KR + 2),(bool *)((long)&KR + 3));
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)pos,(long)ROW._M_dataplus._M_p);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if (pos != (pos_t)psVar1) {
      operator_delete((void *)pos,
                      CONCAT71(ROW._M_string_length._1_7_,(undefined1)ROW._M_string_length) + 1);
    }
  } while( true );
}

Assistant:

int main()
{
    std::cin >> R >> C >> A;
    std::cin.ignore();

    pos_t start(-1, -1);
    bool first_step = true;
    
    field_t field(R, row_t(C, EC_UNKNOWN));
    bool back = false;
    // game loop
    while (1)
    {
        int KR; // row where Kirk is located.
        int KC; // column where Kirk is located.
        std::cin >> KR >> KC;
        std::cin.ignore();
        
        pos_t pos(KR, KC);
        pos_t end;

        for (int i = 0; i < R; i++)
        {
            std::string ROW; // C of the characters in '#.TC?' (i.e. one line of the ASCII maze).
            std::cin >> ROW;
            std::cin.ignore();
            
            std::cerr << ROW << std::endl;
            for (int j = 0; j < C; j++)
            {
                field[i][j] = static_cast<ECell>(ROW[j]);
                if (EC_START == ROW[j])
                {
                    if (first_step)
                    {
                        start = pos;
                        first_step = false;
                    }
                }
            }
        }
        
        bool explore = true;
        std::cout << step(field, pos, back, explore) << std::endl;
    }
}